

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_mkkey(ssh2_transport_state *s,strbuf *out,strbuf *kex_shared_secret,uchar *H,char chr,
               int keylen)

{
  BinarySink *pBVar1;
  int iVar2;
  int iVar3;
  uchar *out_00;
  ssh_hash *h_00;
  ptrlen pVar4;
  int local_5c;
  int offset;
  ssh_hash *h;
  uchar *key;
  int keylen_padded;
  int hlen;
  int keylen_local;
  char chr_local;
  uchar *H_local;
  strbuf *kex_shared_secret_local;
  strbuf *out_local;
  ssh2_transport_state *s_local;
  
  iVar2 = (int)s->kex_alg->hash->hlen;
  if (keylen != 0) {
    iVar3 = ((keylen + iVar2 + -1) / iVar2) * iVar2;
    strbuf_clear(out);
    out_00 = (uchar *)strbuf_append(out,(long)iVar3);
    h_00 = ssh_hash_new(s->kex_alg->hash);
    if (((s->ppl).remote_bugs & 0x20) == 0) {
      pBVar1 = h_00->binarysink_;
      pVar4 = ptrlen_from_strbuf(kex_shared_secret);
      BinarySink_put_datapl(pBVar1,pVar4);
    }
    BinarySink_put_data(h_00->binarysink_,H,(long)iVar2);
    BinarySink_put_byte(h_00->binarysink_,chr);
    BinarySink_put_data(h_00->binarysink_,s->session_id,(long)s->session_id_len);
    ssh_hash_digest(h_00,out_00);
    if (iVar2 < iVar3) {
      ssh_hash_reset(h_00);
      if (((s->ppl).remote_bugs & 0x20) == 0) {
        pBVar1 = h_00->binarysink_;
        pVar4 = ptrlen_from_strbuf(kex_shared_secret);
        BinarySink_put_datapl(pBVar1,pVar4);
      }
      BinarySink_put_data(h_00->binarysink_,H,(long)iVar2);
      for (local_5c = iVar2; local_5c < iVar3; local_5c = iVar2 + local_5c) {
        BinarySink_put_data(h_00->binarysink_,out_00 + ((long)local_5c - (long)iVar2),(long)iVar2);
        ssh_hash_digest_nondestructive(h_00,out_00 + local_5c);
      }
    }
    ssh_hash_free(h_00);
  }
  return;
}

Assistant:

static void ssh2_mkkey(
    struct ssh2_transport_state *s, strbuf *out,
    strbuf *kex_shared_secret, unsigned char *H, char chr, int keylen)
{
    int hlen = s->kex_alg->hash->hlen;
    int keylen_padded;
    unsigned char *key;
    ssh_hash *h;

    if (keylen == 0)
        return;

    /*
     * Round the requested amount of key material up to a multiple of
     * the length of the hash we're using to make it. This makes life
     * simpler because then we can just write each hash output block
     * straight into the output buffer without fiddling about
     * truncating the last one. Since it's going into a strbuf, and
     * strbufs are always smemclr()ed on free, there's no need to
     * worry about leaving extra potentially-sensitive data in memory
     * that the caller didn't ask for.
     */
    keylen_padded = ((keylen + hlen - 1) / hlen) * hlen;

    strbuf_clear(out);
    key = strbuf_append(out, keylen_padded);

    /* First hlen bytes. */
    h = ssh_hash_new(s->kex_alg->hash);
    if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
        put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
    put_data(h, H, hlen);
    put_byte(h, chr);
    put_data(h, s->session_id, s->session_id_len);
    ssh_hash_digest(h, key);

    /* Subsequent blocks of hlen bytes. */
    if (keylen_padded > hlen) {
        int offset;

        ssh_hash_reset(h);
        if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
            put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
        put_data(h, H, hlen);

        for (offset = hlen; offset < keylen_padded; offset += hlen) {
            put_data(h, key + offset - hlen, hlen);
            ssh_hash_digest_nondestructive(h, key + offset);
        }

    }

    ssh_hash_free(h);
}